

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::PutEnv(string *env)

{
  int iVar1;
  char *__name;
  long lVar2;
  string local_40 [8];
  string name;
  size_t pos;
  string *env_local;
  
  name.field_2._8_8_ = std::__cxx11::string::find((char)env,0x3d);
  if (name.field_2._8_8_ == -1) {
    iVar1 = kwsysUnPutEnv(env);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)env);
    __name = (char *)std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::c_str();
    iVar1 = setenv(__name,(char *)(lVar2 + name.field_2._8_8_ + 1),1);
    std::__cxx11::string::~string(local_40);
  }
  env_local._7_1_ = iVar1 == 0;
  return env_local._7_1_;
}

Assistant:

bool SystemTools::PutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if(pos != env.npos)
    {
    std::string name = env.substr(0, pos);
    return setenv(name.c_str(), env.c_str() + pos + 1, 1) == 0;
    }
  else
    {
    return kwsysUnPutEnv(env) == 0;
    }
}